

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.h
# Opt level: O0

StringVector * __thiscall
CoreML::Specification::NonMaximumSuppression::mutable_stringclasslabels(NonMaximumSuppression *this)

{
  bool bVar1;
  StringVector *this_00;
  NonMaximumSuppression *this_local;
  
  bVar1 = has_stringclasslabels(this);
  if (!bVar1) {
    clear_ClassLabels(this);
    set_has_stringclasslabels(this);
    this_00 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_00);
    (this->ClassLabels_).stringclasslabels_ = this_00;
  }
  return (this->ClassLabels_).stringclasslabels_;
}

Assistant:

inline ::CoreML::Specification::StringVector* NonMaximumSuppression::mutable_stringclasslabels() {
  if (!has_stringclasslabels()) {
    clear_ClassLabels();
    set_has_stringclasslabels();
    ClassLabels_.stringclasslabels_ = new ::CoreML::Specification::StringVector;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NonMaximumSuppression.stringClassLabels)
  return ClassLabels_.stringclasslabels_;
}